

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O3

uint stb_vorbis_get_file_offset(stb_vorbis *f)

{
  uint uVar1;
  int64_t iVar2;
  
  if (f->stream == (uint8 *)0x0) {
    iVar2 = (*f->f->seek)(f->f->data,0,1);
    uVar1 = (int)iVar2 - f->f_start;
  }
  else {
    uVar1 = (int)f->stream - *(int *)&f->stream_start;
  }
  return uVar1;
}

Assistant:

unsigned int stb_vorbis_get_file_offset(stb_vorbis *f)
{
   #ifndef STB_VORBIS_NO_PUSHDATA_API
   if (f->push_mode) return 0;
   #endif
   if (USE_MEMORY(f)) return (unsigned int) (f->stream - f->stream_start);
   #ifndef STB_VORBIS_NO_STDIO
   return (unsigned int) (ftell(f->f) - f->f_start);
   #endif
}